

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  file_handle *this;
  _List_node_base *p_Var1;
  undefined4 uVar2;
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *this_00;
  typed_address<char> tVar3;
  undefined8 this_01;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *num;
  element_type *peVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> *transaction_00;
  ulong uVar9;
  _List_node_base *p_Var10;
  indirect_string_adder adder;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  write;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name;
  span<char,__1L> span;
  switches opt;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  strings;
  database database;
  undefined1 local_5cc [20];
  file_handle local_5b8;
  sstring_view<const_char_*> local_588;
  _List_node_base local_578;
  ostream *local_568;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_560;
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_550;
  pair<std::shared_ptr<char>,_pstore::typed_address<char>_> local_548;
  sstring_view<const_char_*> *local_530;
  element_type *local_528;
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *local_520;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  local_518;
  span<char,__1L> local_508;
  string local_4f8;
  vacuum_mode local_4d8;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_4a0;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> local_488;
  undefined1 local_438 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_false>
  local_350;
  undefined1 local_340 [64];
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8 [2];
  vacuum_mode local_2b8;
  undefined1 local_220 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_false>
  local_138;
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  local_128;
  
  local_5cc._0_4_ = 0;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_4d8 = disabled;
  local_4d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4d0;
  local_4d0._M_impl._M_node._M_size = 0;
  local_4b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4b8;
  local_4b8._M_impl._M_node._M_size = 0;
  _Stack_4a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&_Stack_4a0;
  _Stack_4a0._M_impl._M_node._M_size = 0;
  local_4d0._M_impl._M_node.super__List_node_base._M_prev =
       local_4d0._M_impl._M_node.super__List_node_base._M_next;
  local_4b8._M_impl._M_node.super__List_node_base._M_prev =
       local_4b8._M_impl._M_node.super__List_node_base._M_next;
  _Stack_4a0._M_impl._M_node.super__List_node_base._M_prev =
       _Stack_4a0._M_impl._M_node.super__List_node_base._M_next;
  get_switches((pair<switches,_int> *)local_340,argc,argv);
  local_438._0_8_ = local_5cc;
  local_438._8_8_ = &local_4f8;
  std::tuple<switches&,int&>::operator=
            ((tuple<switches&,int&> *)local_438,(pair<switches,_int> *)local_340);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(local_2e8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_300);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_340 + 0x28));
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  uVar2 = local_5cc._0_4_;
  iVar7 = local_5cc._0_4_;
  iVar8 = local_5cc._0_4_;
  if (local_5cc._0_4_ == 0) {
    pstore::database::database((database *)local_340,&local_4f8,writable,true);
    local_2b8 = local_4d8;
    pstore::begin(&local_488,(database *)local_340);
    pstore::index::
    get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
              ((index *)&local_518,(database *)local_340,true);
    local_5cc._16_4_ = uVar2;
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&local_558,(database *)local_340,true);
    if (local_4d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_4d0) {
      p_Var10 = local_4d0._M_impl._M_node.super__List_node_base._M_next;
      do {
        this_00 = local_558;
        p_Var1 = p_Var10[3]._M_prev;
        pstore::transaction_base::alloc_rw<char,void>
                  ((pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)local_438,
                   &local_488.super_transaction_base,(size_t)p_Var1);
        uVar4 = local_438._16_8_;
        this_01 = local_438._8_8_;
        if (p_Var10[3]._M_prev != (_List_node_base *)0x0) {
          memmove((void *)local_438._0_8_,
                  (((_List_impl *)&p_Var10[3]._M_next)->_M_node).super__List_node_base._M_next,
                  (size_t)p_Var10[3]._M_prev);
        }
        if ((string *)this_01 != (string *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        local_5b8.super_file_base._vptr_file_base = (_func_int **)uVar4;
        local_5b8.path_._M_dataplus._M_p = (pointer)p_Var1;
        pstore::index::
        hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
        ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
                  ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
                    *)local_220,this_00,&local_488.super_transaction_base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var10 + 1),(extent<char> *)(local_5cc + 0x14));
        if (local_138._M_head_impl !=
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
             *)0x0) {
          std::
          default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
          ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        *)&local_138,local_138._M_head_impl);
        }
        local_138._M_head_impl =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
              *)0x0;
        p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var10 != (_List_node_base *)&local_4d0);
    }
    if (_Stack_4a0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&_Stack_4a0)
    {
      local_568 = (ostream *)&std::cerr;
      local_530 = (sstring_view<const_char_*> *)&PTR__file_handle_001358d8;
      this = (file_handle *)(local_5cc + 0x14);
      p_Var10 = _Stack_4a0._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_520 = local_558;
        p_Var1 = (((_List_impl *)&p_Var10[3]._M_next)->_M_node).super__List_node_base._M_next;
        local_588.ptr_ = (char *)&local_578;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_588,p_Var1,(long)&(p_Var10[3]._M_prev)->_M_next + (long)p_Var1);
        local_5b8.super_file_base._vptr_file_base = (_func_int **)local_530;
        if ((_List_node_base *)local_588.ptr_ == &local_578) {
          local_5b8.path_.field_2._8_4_ = local_578._M_prev._0_4_;
          local_5b8.path_.field_2._12_4_ = local_578._M_prev._4_4_;
          local_5b8.path_._M_dataplus._M_p = (pointer)&local_5b8.path_.field_2;
        }
        else {
          local_5b8.path_._M_dataplus._M_p = local_588.ptr_;
        }
        local_5b8.path_.field_2._M_allocated_capacity._4_4_ = local_578._M_next._4_4_;
        local_5b8.path_.field_2._M_allocated_capacity._0_4_ = (uint)local_578._M_next;
        local_5b8.path_._M_string_length = local_588.size_;
        local_588.size_ = 0;
        local_578._M_next._0_4_ = (uint)local_578._M_next & 0xffffff00;
        local_5b8.file_ = -1;
        local_5b8.is_writable_ = false;
        local_588.ptr_ = (char *)&local_578;
        pstore::file::file_handle::open(this,(char *)0x1,0,0);
        if (local_5b8.file_ == -1) {
          pstore::file::file_handle::~file_handle(this);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_568,
                              (char *)(((_List_impl *)&p_Var10[3]._M_next)->_M_node).
                                      super__List_node_base._M_next,(long)p_Var10[3]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,": No such file or directory\n",0x1c);
          local_5cc._0_4_ = 1;
        }
        else {
          num = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                pstore::file::file_handle::size(this);
          pstore::transaction_base::alloc_rw<char,void>
                    (&local_548,&local_488.super_transaction_base,(size_t)num);
          tVar3.a_.a_ = local_548.second.a_.a_;
          local_528 = local_548.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_5cc._4_8_ =
               local_548.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          pstore::gsl::details::extent_type<-1L>::extent_type
                    ((extent_type<_1L> *)&local_548,(index_type)num);
          local_508.storage_.super_extent_type<_1L>.size_ =
               (index_type)
               local_548.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_508.storage_.data_ = local_528;
          peVar5 = (element_type *)
                   pstore::file::file_base::read_span<pstore::gsl::span<char,_1l>,void>
                             ((file_base *)this,&local_508);
          if (local_508.storage_.super_extent_type<_1L>.size_ < 0) {
            pstore::assert_failed
                      ("expected_size >= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/write/main.cpp"
                       ,0x43);
          }
          if (peVar5 != (element_type *)local_508.storage_.super_extent_type<_1L>.size_) {
            std::operator<<(local_568,"Did not read the number of bytes requested");
            exit(1);
          }
          local_548.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)tVar3.a_.a_;
          local_548.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               num;
          pstore::index::
          hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
          ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
                    ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
                      *)local_438,local_520,&local_488.super_transaction_base,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var10 + 1),(extent<char> *)&local_548);
          if ((_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
               )local_350._M_head_impl !=
              (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
               *)0x0) {
            std::
            default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
            ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                          *)&local_350,local_350._M_head_impl);
          }
          local_350._M_head_impl =
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5cc._4_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5cc._4_8_);
          }
          pstore::file::file_handle::~file_handle(this);
        }
        p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var10 != (_List_node_base *)&_Stack_4a0);
    }
    local_438._0_8_ = (database_reference)0x0;
    local_438._8_8_ = (string *)0x0;
    local_438._16_8_ = 0;
    std::
    vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ::reserve((vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
               *)local_438,local_4b8._M_impl._M_node._M_size);
    local_5b8.super_file_base._vptr_file_base = (_func_int **)0x0;
    local_5b8.path_._M_dataplus._M_p = (pointer)0x0;
    local_5b8.path_._M_string_length = 0;
    if (local_4b8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_4b8) {
      p_Var10 = local_4b8._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_588.ptr_ = (char *)p_Var10[1]._M_next;
        local_588.size_ = (size_type)p_Var10[1]._M_prev;
        if (local_438._8_8_ == local_438._16_8_) {
          std::
          vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>
          ::_M_realloc_insert<pstore::sstring_view<char_const*>>
                    ((vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>
                      *)local_438,(iterator)local_438._8_8_,&local_588);
        }
        else {
          *(char **)((signature_type *)local_438._8_8_)->_M_elems = local_588.ptr_;
          *(size_type *)(local_438._8_8_ + 8) = local_588.size_;
          local_438._8_8_ = local_438._8_8_ + 0x10;
        }
        local_560.ptr_ =
             (sstring_view<const_char_*> *)&((internal_node *)(local_438._8_8_ + -0x18))->bitmap_;
        pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant
                  (&local_560);
        pstore::indirect_string_adder::
        add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
                  (&local_128,(indirect_string_adder *)(local_5cc + 0x14),
                   &local_488.super_transaction_base,&local_518,local_560);
        if (local_128.first.it_.pos_._M_t.
            super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
            .
            super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
             )0x0) {
          operator_delete((void *)local_128.first.it_.pos_._M_t.
                                  super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                                  .
                                  super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                                  ._M_head_impl,0x20);
        }
        local_128.first.it_.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>,_true,_true>
              )(__uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                )0x0;
        p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var10 != (_List_node_base *)&local_4b8);
    }
    transaction_00 = &local_488;
    pstore::indirect_string_adder::flush
              ((indirect_string_adder *)(local_5cc + 0x14),&transaction_00->super_transaction_base);
    iVar8 = (int)transaction_00;
    pstore::transaction_base::commit(&local_488.super_transaction_base);
    iVar7 = local_5cc._16_4_;
    if ((sstring_view<const_char_*> *)local_5b8.super_file_base._vptr_file_base !=
        (sstring_view<const_char_*> *)0x0) {
      uVar9 = local_5b8.path_._M_string_length - (long)local_5b8.super_file_base._vptr_file_base;
      operator_delete(local_5b8.super_file_base._vptr_file_base,uVar9);
      iVar8 = (int)uVar9;
    }
    if ((database_reference)local_438._0_8_ != (database_reference)0x0) {
      uVar9 = local_438._16_8_ - local_438._0_8_;
      operator_delete((void *)local_438._0_8_,uVar9);
      iVar8 = (int)uVar9;
    }
    if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550);
    }
    if (local_518.
        super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_518.
                 super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_488.super_transaction_base._vptr_transaction_base =
         (_func_int **)&PTR__transaction_00134d18;
    pstore::transaction_base::rollback(&local_488.super_transaction_base);
    pstore::lock_guard<pstore::transaction_mutex>::~lock_guard(&local_488.lock_);
    pstore::database::close((database *)local_340,iVar8);
    pstore::database::~database((database *)local_340);
    iVar8 = 0;
  }
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&_Stack_4a0);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_4b8);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar7 == 0) {
    iVar8 = local_5cc._0_4_;
  }
  return iVar8;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    using pstore::utf::to_native_string;

    PSTORE_TRY {
        switches opt;
        std::tie (opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

        pstore::database database (opt.db_path, pstore::database::access_mode::writable);
        database.set_vacuum_mode (opt.vmode);

        {
            // Start a transaction...
            auto transaction = pstore::begin (database);

            // Read the write and name indexes.
            std::shared_ptr<pstore::index::name_index> const name =
                pstore::index::get_index<pstore::trailer::indices::name> (database);
            std::shared_ptr<pstore::index::write_index> const write =
                pstore::index::get_index<pstore::trailer::indices::write> (database);

            // Scan through the string value arguments from the command line. These are of
            // the form key,value where value is a string which is stored directly.
            for (std::pair<std::string, std::string> const & v : opt.add) {
                write->insert_or_assign (transaction, v.first,
                                         append_string (transaction, v.second));
            }

            // Now record the files requested on the command line.
            for (std::pair<std::string, std::string> const & v : opt.files) {
                if (!add_file (transaction, *write, v.first, v.second)) {
                    error_stream << to_native_string (v.second)
                                 << PSTORE_NATIVE_TEXT (": No such file or directory\n");
                    exit_code = EXIT_FAILURE;
                }
            }

            // Scan through the string arguments from the command line.
            std::vector<pstore::raw_sstring_view> strings;
            strings.reserve (opt.strings.size ());
            pstore::indirect_string_adder adder;
            for (std::string const & str : opt.strings) {
                strings.emplace_back (pstore::make_sstring_view (str));
                auto & s = strings.back ();
                adder.add (transaction, name, &s);
            }
            adder.flush (transaction);

            transaction.commit ();
        }

        database.close ();
    }